

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_freelist(Cookie *co,_Bool cookiestoo)

{
  Cookie *pCVar1;
  Cookie *next;
  Cookie *pCStack_10;
  _Bool cookiestoo_local;
  Cookie *co_local;
  
  pCStack_10 = co;
  if (co != (Cookie *)0x0) {
    while (pCStack_10 != (Cookie *)0x0) {
      pCVar1 = pCStack_10->next;
      if (cookiestoo) {
        freecookie(pCStack_10);
        pCStack_10 = pCVar1;
      }
      else {
        (*Curl_cfree)(pCStack_10);
        pCStack_10 = pCVar1;
      }
    }
  }
  return;
}

Assistant:

void Curl_cookie_freelist(struct Cookie *co, bool cookiestoo)
{
  struct Cookie *next;
  if(co) {
    while(co) {
      next = co->next;
      if(cookiestoo)
        freecookie(co);
      else
        free(co); /* we only free the struct since the "members" are all just
                     pointed out in the main cookie list! */
      co = next;
    }
  }
}